

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_destroy(exr_context_t ctxt,exr_attr_string_t *s)

{
  undefined8 *in_RSI;
  long in_RDI;
  exr_attr_string_t nil;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  long local_10;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (undefined8 *)0x0) {
      local_18 = in_RSI;
      local_10 = in_RDI;
      memset(&local_28,0,0x10);
      if ((local_18[1] != 0) && (0 < *(int *)((long)local_18 + 4))) {
        (**(code **)(local_10 + 0x60))(local_18[1]);
      }
      *local_18 = local_28;
      local_18[1] = local_20;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_destroy (exr_context_t ctxt, exr_attr_string_t* s)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (s)
    {
        exr_attr_string_t nil = {0};
        if (s->str && s->alloc_size > 0)
            ctxt->free_fn ((char*) (uintptr_t) s->str);
        *s = nil;
    }
    return EXR_ERR_SUCCESS;
}